

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::SharedLibraryShellCommand::executeExternalCommand
          (SharedLibraryShellCommand *this,BuildSystem *param_1,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessAttributes attributes;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_130;
  function<void_(llbuild::basic::ProcessResult)> local_108;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_e8;
  undefined1 local_c0;
  undefined1 uStack_bf;
  undefined6 uStack_be;
  StringRef local_b8;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined6 uStack_a6;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> local_a0;
  allocator<llvm::StringRef> local_89;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_78;
  ArrayRef<llvm::StringRef> local_60;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn_local;
  QueueJobContext *context_local;
  BuildSystem *param_2_local;
  SharedLibraryShellCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (SharedLibraryShellCommand *)ti.impl;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)completionFn;
  (anonymous_namespace)::SharedLibraryShellCommand::getArgs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,this);
  local_80._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50);
  std::allocator<llvm::StringRef>::allocator(&local_89);
  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_78,local_80,local_88,
             &local_89);
  llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>(&local_60,&local_78);
  memset(&local_a0,0,0x10);
  llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::ArrayRef(&local_a0);
  local_c0 = 1;
  uStack_bf = 0;
  memset(&local_b8,0,0x10);
  llvm::StringRef::StringRef(&local_b8);
  local_a8 = 1;
  uStack_a7 = 1;
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
            (&local_130,completionFn);
  std::function<void(llbuild::basic::ProcessResult)>::
  function<(anonymous_namespace)::SharedLibraryShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::_lambda(llbuild::basic::ProcessResult)_1_,void>
            ((function<void(llbuild::basic::ProcessResult)> *)&local_108,
             (anon_class_40_1_0860c3c2 *)&local_130);
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
            (&local_e8,&local_108);
  attributes.connectToConsole = (bool)uStack_bf;
  attributes.canSafelyInterrupt = (bool)local_c0;
  attributes._2_6_ = uStack_be;
  attributes.controlEnabled = (bool)uStack_a7;
  attributes.inheritEnvironment = (bool)local_a8;
  attributes._26_6_ = uStack_a6;
  attributes.workingDir.Data = local_b8.Data;
  attributes.workingDir.Length = local_b8.Length;
  llbuild::core::TaskInterface::spawn
            ((TaskInterface *)&this_local,context,local_60,local_a0,attributes,&local_e8,
             (ProcessDelegate *)0x0);
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::~Optional(&local_e8);
  std::function<void_(llbuild::basic::ProcessResult)>::~function(&local_108);
  (anonymous_namespace)::SharedLibraryShellCommand::
  executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
  ::{lambda(llbuild::basic::ProcessResult)#1}::~Optional
            ((_lambda_llbuild__basic__ProcessResult__1_ *)&local_130);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_78);
  std::allocator<llvm::StringRef>::~allocator(&local_89);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&, TaskInterface ti, QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {

    auto args = getArgs();
    ti.spawn(
        context, std::vector<StringRef>(args.begin(), args.end()), {},
        {true}, {[completionFn](ProcessResult result) {
          if (completionFn.hasValue())
            completionFn.getValue()(result);
        }});
  }